

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option_group_test.cpp
# Opt level: O0

void testOptionGroup_optionMissing_shouldNotReferToVariants_shouldFail(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  __type _Var1;
  runtime_error *e;
  string error;
  bool a3Called;
  bool a2Called;
  Argengine ae;
  char *a3;
  char *a2;
  char *a1;
  char *in_stack_fffffffffffff9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9d8;
  function<void_()> *in_stack_fffffffffffff9e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9f0;
  allocator_type *in_stack_fffffffffffff9f8;
  allocator<char> *in_stack_fffffffffffffa00;
  iterator in_stack_fffffffffffffa08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa10;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffa18;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffa28;
  string *local_580;
  string *local_540;
  string *local_4f8;
  string *local_4b0;
  allocator<char> local_471;
  string local_470 [32];
  string local_450 [32];
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [40];
  string local_368 [37];
  undefined1 local_343;
  allocator<char> local_342;
  allocator<char> local_341;
  string *local_340;
  string local_338 [32];
  undefined1 local_318 [32];
  string *local_2f8;
  undefined8 local_2f0;
  undefined1 local_2e8 [55];
  allocator<char> local_2b1;
  string local_2b0 [32];
  byte *local_290;
  undefined1 local_288 [38];
  undefined1 local_262;
  allocator<char> local_261;
  string local_260 [39];
  allocator<char> local_239;
  string *local_238;
  string local_230 [32];
  undefined1 local_210 [32];
  string *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0 [54];
  byte local_1aa;
  allocator<char> local_1a9;
  string local_1a8 [32];
  byte *local_188;
  undefined1 local_180 [38];
  undefined1 local_15a;
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string *local_130;
  string local_128 [32];
  undefined1 local_108 [32];
  string *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [48];
  byte local_a8 [2];
  undefined1 local_a6;
  allocator<char> local_a5 [20];
  allocator<char> local_91;
  string *local_90;
  string local_88 [32];
  undefined1 local_68 [32];
  string *local_48;
  undefined8 local_40;
  undefined1 local_38 [24];
  Argengine local_20 [8];
  char *local_18;
  char *local_10;
  char *local_8;
  
  local_8 = "a1";
  local_10 = "a2";
  local_18 = "a3";
  local_a6 = 1;
  local_90 = local_88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  local_90 = (string *)local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  local_a6 = 0;
  local_48 = local_88;
  local_40 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x108624);
  __l._M_len = (size_type)in_stack_fffffffffffffa10;
  __l._M_array = in_stack_fffffffffffffa08;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffa00,__l,in_stack_fffffffffffff9f8);
  juzzlin::Argengine::Argengine(local_20,local_38,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff9e0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x108681);
  local_4b0 = (string *)&local_48;
  do {
    local_4b0 = local_4b0 + -0x20;
    std::__cxx11::string::~string(local_4b0);
  } while (local_4b0 != local_88);
  std::allocator<char>::~allocator(local_a5);
  std::allocator<char>::~allocator(&local_91);
  local_a8[0] = 0;
  local_15a = 1;
  local_130 = local_128;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  local_130 = (string *)local_108;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  std::operator+(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  local_15a = 0;
  local_e8 = local_128;
  local_e0 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x1087ea);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(in_stack_fffffffffffffa20,in_stack_fffffffffffffa28,in_stack_fffffffffffffa18,
        (allocator_type *)in_stack_fffffffffffffa10);
  local_188 = local_a8;
  std::function<void()>::
  function<testOptionGroup_optionMissing_shouldNotReferToVariants_shouldFail()::__0,void>
            (in_stack_fffffffffffff9e0,(anon_class_8_1_11140c4c *)in_stack_fffffffffffff9d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  juzzlin::Argengine::addOption(local_20,local_d8,local_180,0,local_1a8);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::function<void_()>::~function((function<void_()> *)0x1088c1);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1088ce);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x1088db);
  local_4f8 = (string *)&local_e8;
  do {
    local_4f8 = local_4f8 + -0x20;
    std::__cxx11::string::~string(local_4f8);
  } while (local_4f8 != local_128);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::~allocator(&local_131);
  local_1aa = 0;
  local_262 = 1;
  local_238 = local_230;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  local_238 = (string *)local_210;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  std::operator+(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  local_262 = 0;
  local_1f0 = local_230;
  local_1e8 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x108a51);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(in_stack_fffffffffffffa20,in_stack_fffffffffffffa28,in_stack_fffffffffffffa18,
        (allocator_type *)in_stack_fffffffffffffa10);
  local_290 = &local_1aa;
  std::function<void()>::
  function<testOptionGroup_optionMissing_shouldNotReferToVariants_shouldFail()::__1,void>
            (in_stack_fffffffffffff9e0,(anon_class_8_1_45fa478d *)in_stack_fffffffffffff9d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  juzzlin::Argengine::addOption(local_20,local_1e0,local_288,0,local_2b0);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::function<void_()>::~function((function<void_()> *)0x108b28);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x108b35);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x108b42);
  local_540 = (string *)&local_1f0;
  do {
    local_540 = local_540 + -0x20;
    std::__cxx11::string::~string(local_540);
  } while (local_540 != local_230);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator(&local_261);
  std::allocator<char>::~allocator(&local_239);
  local_343 = 1;
  local_340 = local_338;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  local_340 = (string *)local_318;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  local_343 = 0;
  local_2f8 = local_338;
  local_2f0 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x108c92);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(in_stack_fffffffffffffa20,in_stack_fffffffffffffa28,in_stack_fffffffffffffa18,
        (allocator_type *)in_stack_fffffffffffffa10);
  juzzlin::Argengine::addOptionGroup(local_20,local_2e8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x108ce5);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x108cf2);
  local_580 = (string *)&local_2f8;
  do {
    local_580 = local_580 + -0x20;
    std::__cxx11::string::~string(local_580);
  } while (local_580 != local_338);
  std::allocator<char>::~allocator(&local_342);
  std::allocator<char>::~allocator(&local_341);
  std::__cxx11::string::string(local_368);
  juzzlin::Argengine::parse();
  if (((local_a8[0] ^ 0xff) & 1) == 0) {
    __assert_fail("!a2Called",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/option_group_test/option_group_test.cpp"
                  ,0x71,"void testOptionGroup_optionMissing_shouldNotReferToVariants_shouldFail()");
  }
  if (((local_1aa ^ 0xff) & 1) == 0) {
    __assert_fail("!a3Called",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/option_group_test/option_group_test.cpp"
                  ,0x72,"void testOptionGroup_optionMissing_shouldNotReferToVariants_shouldFail()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  std::operator+(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  std::operator+(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  std::operator+(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  std::operator+(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  std::operator+(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  std::operator+(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  std::operator+(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  _Var1 = std::operator==(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  if (!_Var1) {
    __assert_fail("error == std::string(name) + \": These options must coexist: \'\" + a2 + \"\', \'\" + a3 + \"\'. Missing options: \'\" + a2 + \"\'.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/option_group_test/option_group_test.cpp"
                  ,0x73,"void testOptionGroup_optionMissing_shouldNotReferToVariants_shouldFail()");
  }
  std::__cxx11::string::~string(local_390);
  std::__cxx11::string::~string(local_3b0);
  std::__cxx11::string::~string(local_3d0);
  std::__cxx11::string::~string(local_3f0);
  std::__cxx11::string::~string(local_410);
  std::__cxx11::string::~string(local_430);
  std::__cxx11::string::~string(local_450);
  std::__cxx11::string::~string(local_470);
  std::allocator<char>::~allocator(&local_471);
  std::__cxx11::string::~string(local_368);
  juzzlin::Argengine::~Argengine(local_20);
  return;
}

Assistant:

void testOptionGroup_optionMissing_shouldNotReferToVariants_shouldFail()
{
    const auto a1 = "a1";
    const auto a2 = "a2";
    const auto a3 = "a3";
    Argengine ae({ a1, a3 });
    bool a2Called {};
    ae.addOption({ a2, std::string("--") + a2 }, [&] {
        a2Called = true;
    });
    bool a3Called {};
    ae.addOption({ a3, std::string("--") + a3 }, [&] {
        a3Called = true;
    });
    ae.addOptionGroup({ a2, a3 });
    std::string error;
    try {
        ae.parse();
    } catch (std::runtime_error & e) {
        error = e.what();
    }
    assert(!a2Called);
    assert(!a3Called);
    assert(error == std::string(name) + ": These options must coexist: '" + a2 + "', '" + a3 + "'. Missing options: '" + a2 + "'.");
}